

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.c
# Opt level: O0

void pnga_bin_index(Integer g_bin,Integer g_cnt,Integer g_off,Integer *values,Integer *subs,
                   Integer n,Integer sortit)

{
  void *__ptr;
  void *__ptr_00;
  Integer *lo_00;
  long in_RCX;
  long in_R8;
  long in_R9;
  Integer unaff_retaddr;
  long in_stack_00000008;
  Integer in_stack_00000010;
  int elems;
  Integer selected_1;
  Integer hi;
  Integer lo;
  int cnbin;
  int selected;
  Integer nbin;
  Integer ndim;
  Integer type;
  int *offset;
  int *all_bin_contrib;
  int my_nbin;
  int i;
  Integer in_stack_00000108;
  char *in_stack_00000110;
  Integer *in_stack_00000120;
  void *in_stack_00000128;
  Integer *in_stack_00000130;
  Integer *in_stack_00000138;
  Integer in_stack_00000140;
  Integer *in_stack_00000178;
  Integer *in_stack_00000180;
  Integer *in_stack_00000188;
  Integer in_stack_00000190;
  Integer *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  uint uVar1;
  Integer *hi_00;
  int *in_stack_ffffffffffffff88;
  long in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff9c;
  undefined4 local_60;
  int in_stack_ffffffffffffffa4;
  long local_58;
  long local_50;
  uint local_34;
  
  pnga_inquire(in_stack_00000190,in_stack_00000188,in_stack_00000180,in_stack_00000178);
  if (local_58 != 1) {
    pnga_error(in_stack_00000110,in_stack_00000108);
  }
  if (((local_50 != 0x3e9) && (local_50 != 0x3ea)) && (local_50 != 0x3f8)) {
    pnga_error(in_stack_00000110,in_stack_00000108);
  }
  __ptr = calloc(CONCAT44(in_stack_ffffffffffffffa4,local_60),4);
  if (__ptr == (void *)0x0) {
    pnga_error(in_stack_00000110,in_stack_00000108);
  }
  __ptr_00 = malloc(CONCAT44(in_stack_ffffffffffffffa4,local_60) << 2);
  if (__ptr_00 == (void *)0x0) {
    pnga_error(in_stack_00000110,in_stack_00000108);
  }
  for (local_34 = 0; (int)local_34 < in_R9; local_34 = local_34 + 1) {
    in_stack_ffffffffffffff9c = (int)*(undefined8 *)(in_R8 + (long)(int)local_34 * 8);
    if ((in_stack_ffffffffffffff9c < 1) ||
       (CONCAT44(in_stack_ffffffffffffffa4,local_60) < (long)in_stack_ffffffffffffff9c)) {
      pnga_error(in_stack_00000110,in_stack_00000108);
    }
    *(int *)((long)__ptr + (long)(in_stack_ffffffffffffff9c + -1) * 4) =
         *(int *)((long)__ptr + (long)(in_stack_ffffffffffffff9c + -1) * 4) + 1;
  }
  for (local_34 = 0; (long)(int)local_34 < CONCAT44(in_stack_ffffffffffffffa4,local_60);
      local_34 = local_34 + 2000) {
    if ((long)(int)(local_34 + 2000) < CONCAT44(in_stack_ffffffffffffffa4,local_60)) {
      in_stack_ffffffffffffff70 = (Integer *)0x7d0;
    }
    else {
      in_stack_ffffffffffffff70 =
           (Integer *)(CONCAT44(in_stack_ffffffffffffffa4,local_60) - (long)(int)local_34);
    }
    sgai_bin_offset(in_stack_ffffffffffffffa4,
                    (int *)CONCAT44(in_stack_ffffffffffffff9c,(int)in_stack_ffffffffffffff70),
                    (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),in_stack_ffffffffffffff88);
  }
  local_34 = 0;
  do {
    if (in_R9 <= (int)local_34) {
LAB_0018b1f4:
      free(__ptr_00);
      free(__ptr);
      if (in_stack_00000008 == 0) {
        pnga_sync();
      }
      else {
        pnga_bin_sorter(in_stack_00000010,in_stack_00000008,unaff_retaddr);
      }
      return;
    }
    hi_00 = *(Integer **)(in_R8 + (long)(int)local_34 * 8);
    uVar1 = *(uint *)((long)__ptr + ((long)hi_00 + -1) * 4);
    pnga_get(in_stack_00000140,in_stack_00000138,in_stack_00000130,in_stack_00000128,
             in_stack_00000120);
    in_stack_ffffffffffffff90 =
         (*(int *)((long)__ptr_00 + ((long)hi_00 + -1) * 4) + 1) + in_stack_ffffffffffffff90;
    lo_00 = (Integer *)(in_stack_ffffffffffffff90 + (int)uVar1 + -1);
    if (CONCAT44(in_stack_ffffffffffffffa4,local_60) < in_stack_ffffffffffffff90) {
      printf("Writing off end of bins array: index=%d elems=%d lo=%ld hi=%ld values=%ld nbin=%ld\n",
             (ulong)local_34,(ulong)uVar1,in_stack_ffffffffffffff90,lo_00,in_RCX + (int)local_34,
             CONCAT44(in_stack_ffffffffffffffa4,local_60));
      goto LAB_0018b1f4;
    }
    pnga_put(in_stack_ffffffffffffff90,lo_00,hi_00,(void *)CONCAT44(uVar1,in_stack_ffffffffffffff78)
             ,in_stack_ffffffffffffff70);
    local_34 = uVar1 + local_34;
  } while( true );
}

Assistant:

void pnga_bin_index(Integer g_bin, Integer g_cnt, Integer g_off, 
                   Integer *values, Integer *subs, Integer n, Integer sortit)
{
int i, my_nbin=0;
int *all_bin_contrib, *offset;
Integer type, ndim, nbin;

    pnga_inquire(g_bin, &type, &ndim, &nbin);
    if(ndim !=1) pnga_error("ga_bin_index: 1-dim array required",ndim);
    if(type!= C_INT && type!=C_LONG && type!=C_LONGLONG)
       pnga_error("ga_bin_index: not integer type",type);

    all_bin_contrib = (int*)calloc(nbin,sizeof(int));
    if(!all_bin_contrib)pnga_error("ga_binning:calloc failed",nbin);
    offset = (int*)malloc(nbin*sizeof(int));
    if(!offset)pnga_error("ga_binning:malloc failed",nbin);

    /* count how many elements go to each bin */
    for(i=0; i< n; i++){
       int selected = subs[i];
       if(selected <1 || selected> nbin) pnga_error("wrong bin",selected);

       if(all_bin_contrib[selected-1] ==0) my_nbin++; /* new bin found */
       all_bin_contrib[selected-1]++;
    }

    /* process bins in chunks to match available buffer space */
    for(i=0; i<nbin; i+=NWORK){
        int cnbin = ((i+NWORK)<nbin) ? NWORK: nbin -i;
        sgai_bin_offset(SCOPE_ALL, all_bin_contrib+i, cnbin, offset+i);
    }

    for(i=0; i< n; ){
       Integer lo, hi;
       Integer selected = subs[i];
       int elems = all_bin_contrib[selected-1];

       pnga_get(g_off,&selected,&selected, &lo, &selected);
       lo += offset[selected-1]+1;
       hi = lo + elems -1;
/*
       printf("%d: elems=%d lo=%d sel=%d off=%d contrib=%d nbin=%d\n",pnga_nodeid(), elems, lo, selected,offset[selected-1],all_bin_contrib[0],nbin);
*/
       if(lo > nbin) {
	      printf("Writing off end of bins array: index=%d elems=%d lo=%ld hi=%ld values=%ld nbin=%ld\n",
                i,elems,(long)lo,(long)hi,(long)values+i,(long)nbin);
         break;   
       }else{
          pnga_put(g_bin, &lo, &hi, values+i, &selected); 
       }
       i+=elems;
    }
    
    free(offset);
    free(all_bin_contrib);

    if(sortit)pnga_bin_sorter(g_bin, g_cnt, g_off);
    else pnga_sync();
}